

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::erase
          (iterator *__return_storage_ptr__,
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,iterator pos)

{
  value_type *pvVar1;
  iterator it;
  Node *pNVar2;
  InnerMap *pIVar3;
  size_type sVar4;
  iterator i;
  
  if (this->arena_ == (Arena *)0x0) {
    pvVar1 = ((pos.it_.node_)->kv).v_;
    if (pvVar1 != (value_type *)0x0) {
      std::__cxx11::string::~string((string *)&pvVar1->second);
    }
    operator_delete(pvVar1,0x28);
  }
  sVar4 = pos.it_.bucket_index_;
  pIVar3 = pos.it_.m_;
  pNVar2 = pos.it_.node_;
  InnerMap::
  iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::operator++(&pos.it_);
  it.m_ = pIVar3;
  it.node_ = pNVar2;
  it.bucket_index_ = sVar4;
  InnerMap::erase(this->elements_,it);
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }